

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  iterator __begin1;
  pointer sequence;
  string *sequence_00;
  ulong uVar6;
  ulong uVar7;
  iterator __end1;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs;
  double energy;
  string input_file;
  string file;
  string output_file_k;
  string input_type;
  string structure;
  string final;
  string consensus;
  string local_4f8;
  string seq_2;
  args_info args_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  ofstream out;
  istringstream ss;
  
  iVar4 = cmdline_parser(argc,argv,&args_info);
  if (iVar4 == 0) {
    input_file._M_dataplus._M_p = (pointer)&input_file.field_2;
    input_file._M_string_length = 0;
    input_file.field_2._M_local_buf[0] = '\0';
    if (args_info.inputs_num == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&input_file);
    }
    else {
      std::__cxx11::string::assign((char *)&input_file);
    }
    input_type._M_dataplus._M_p = (pointer)&input_type.field_2;
    input_type._M_string_length = 0;
    input_type.field_2._M_local_buf[0] = '\0';
    if (args_info.input_type_given == 0) {
      std::__cxx11::string::assign((char *)&input_type);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&input_type);
    }
    output_file_k._M_dataplus._M_p = (pointer)&output_file_k.field_2;
    output_file_k._M_string_length = 0;
    output_file_k.field_2._M_local_buf[0] = '\0';
    if (args_info.output_file_given == 0) {
      std::__cxx11::string::assign((char *)&output_file_k);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&output_file_k);
    }
    if (args_info.paramFile_given == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file,"params/rna_DirksPierce09.par",(allocator<char> *)&out);
    }
    else {
      std::__cxx11::string::string((string *)&file,(string *)&parameter_file_abi_cxx11_);
    }
    bVar3 = exists(&file);
    if (bVar3) {
      vrna_params_load(file._M_dataplus._M_p,0);
    }
    iVar4 = dangle_model;
    if (args_info.dangles_given == 0) {
      iVar4 = 2;
    }
    cmdline_parser_free(&args_info);
    bVar3 = exists(&input_file);
    if (bVar3) {
      seqs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      seqs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      seqs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      seqs2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      seqs2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      seqs2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      updateVectors(&seqs,&seqs2,&names,&input_file,&input_type);
      pbVar2 = seqs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (ulong)((long)seqs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)seqs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5;
      for (sequence = seqs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = seqs2.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          sequence_00 = seqs2.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, sequence != pbVar2;
          sequence = sequence + 1) {
        seqtoRNA(sequence);
      }
      for (; sequence_00 != pbVar1; sequence_00 = sequence_00 + 1) {
        seqtoRNA(sequence_00);
      }
      MIVector(&structure,&seqs);
      if (args_info.verbose_given != 0) {
        printf("\t The number of sequences are %d\n",uVar6 & 0xffffffff);
        printf("\t The structure found through covariation of the alignment is: \n\n%s\n",
               structure._M_dataplus._M_p);
      }
      std::ofstream::ofstream(&out,(string *)&output_file_k,_S_trunc);
      uVar8 = 0;
      uVar7 = uVar6 & 0xffffffff;
      if ((int)uVar6 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 << 5 != uVar8; uVar8 = uVar8 + 0x20) {
        std::__cxx11::string::string
                  ((string *)&local_3d0,
                   (string *)
                   ((long)&((seqs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8))
        ;
        std::__cxx11::string::string((string *)&local_3f0,(string *)&structure);
        returnUngapped(&consensus,&local_3d0,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::string
                  ((string *)&local_410,
                   (string *)
                   ((long)&((seqs2.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8))
        ;
        removeIUPAC(&seq_2,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::string((string *)&local_4f8,(string *)&seq_2);
        std::__cxx11::string::string((string *)&local_430,(string *)&consensus);
        Iterative_Fold(&final,&local_4f8,&local_430,&energy,iVar4);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::substr
                  ((ulong)&ss,
                   (long)&((names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,".seq");
        std::__cxx11::string::~string((string *)&ss);
        if (bVar3) {
          std::__cxx11::string::substr
                    ((ulong)&ss,
                     (long)&((names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8)
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8
                     ),(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
        std::__cxx11::string::substr
                  ((ulong)&ss,
                   (long)&((names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,".ct");
        std::__cxx11::string::~string((string *)&ss);
        if (bVar3) {
          std::__cxx11::string::substr
                    ((ulong)&ss,
                     (long)&((names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8)
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8
                     ),(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&ss,
                   (string *)
                   ((long)&((names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8),
                   _S_in);
        std::operator>>((istream *)&ss,
                        (string *)
                        ((long)&((names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        uVar8));
        std::operator+(&local_450,">",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((names.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       uVar8));
        poVar5 = std::operator<<((ostream *)&out,(string *)&local_450);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_450);
        poVar5 = std::operator<<((ostream *)&out,
                                 (string *)
                                 ((long)&((seqs2.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + uVar8));
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&out,(string *)&final);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::ostream::_M_insert<double>(energy);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::endl<char,std::char_traits<char>>((ostream *)&out);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        std::__cxx11::string::~string((string *)&final);
        std::__cxx11::string::~string((string *)&seq_2);
        std::__cxx11::string::~string((string *)&consensus);
      }
      std::ofstream::close();
      std::ofstream::~ofstream(&out);
      std::__cxx11::string::~string((string *)&structure);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&seqs2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&seqs);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&output_file_k);
      std::__cxx11::string::~string((string *)&input_type);
      std::__cxx11::string::~string((string *)&input_file);
      return 0;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Input File does not exist!");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {


    args_info args_info;

	// get options (call gengetopt command line parser)
	if (cmdline_parser (argc, argv, &args_info) != 0) {
	exit(1);
	}

	std::string input_file;
	if (args_info.inputs_num>0) {
	input_file=args_info.inputs[0];
	} else {
	std::getline(std::cin,input_file);
	}
    bool verbose;
	verbose = args_info.verbose_given;

    // bool stacking;
    // stacking = args_info.stacking_given;

    std::string input_type;
    args_info.input_type_given ? input_type = type : input_type = "FASTA";

    std::string output_file_k;
    args_info.output_file_given ? output_file_k = output_file : output_file_k = "results.afa";

    std::string file= args_info.paramFile_given ? parameter_file : "params/rna_DirksPierce09.par";
	if(exists(file)){
		vrna_params_load(file.c_str(), VRNA_PARAMETER_FORMAT_DEFAULT);
	}

    int dangles = args_info.dangles_given ? dangle_model : 2;

    cmdline_parser_free(&args_info);

    if(!exists(input_file)){
        std::cout << "Input File does not exist!" << std::endl;
        exit (EXIT_FAILURE);
    }



    // Define the data structures for the sequences
    std::vector <std::string> seqs;
    std::vector <std::string> seqs2;
    std::vector <std::string> names;

    updateVectors(seqs,seqs2,names,input_file, input_type);

    // number of sequences
    int n_seq = seqs.size();

    // Converts any possible T's to U's in the sequences
    for(std::string &seq : seqs) seqtoRNA(seq);
    for(std::string &seq : seqs2) seqtoRNA(seq);

    // Uses covariation/ Mutual Information to find probable structurally important base pairs
    std::string structure = MIVector(seqs);

    if(verbose){
      printf ("\t The number of sequences are %d\n", n_seq);
      printf ("\t The structure found through covariation of the alignment is: \n\n%s\n", structure.c_str());  
    }
    
    // The output file
    std::ofstream out(output_file_k, std::ofstream::trunc);
    for(int i=0; i<n_seq; ++i){
    
        std::string consensus = returnUngapped(seqs[i],structure);
        std::string seq = removeIUPAC(seqs2[i]);
        double energy;        

        std::string final = Iterative_Fold(seq,consensus, energy, dangles);
    
        // makes sure name is in correct format
        if(names[i].substr(names[i].length()-4,4) == ".seq") names[i] = names[i].substr(0,names[i].length()-4);
        if(names[i].substr(names[i].length()-3,3) == ".ct") names[i] = names[i].substr(0,names[i].length()-3);
        std::istringstream ss(names[i]);
        ss >> names[i];

        /**   Outputting to file     **/
        out << ">" + names[i] << std::endl;
        out << seqs2[i] << std::endl;
        out << final << std::endl;
        out << energy << std::endl;
        out << std::endl;
    }
    out.close();
    
    return 0;
}